

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<wasm::Ok> * __thiscall
wasm::WATParser::ParseDefsCtx::makeCallIndirect
          (Result<wasm::Ok> *__return_storage_ptr__,ParseDefsCtx *this,Index pos,
          vector<wasm::WATParser::Annotation,_std::allocator<wasm::WATParser::Annotation>_>
          *annotations,Name *table,HeapType type,bool isReturn)

{
  undefined8 *puVar1;
  _Copy_ctor_base<false,_wasm::Name,_wasm::Err> *p_Var2;
  Name table_00;
  _Variant_storage<false,_wasm::Ok,_wasm::Err> local_c8;
  undefined1 local_a0 [8];
  Result<wasm::Name> t;
  Result<wasm::Name> _val;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  undefined8 uStack_38;
  
  getTable((Result<wasm::Name> *)local_a0,this,pos,table);
  std::__detail::__variant::_Copy_ctor_base<false,_wasm::Name,_wasm::Err>::_Copy_ctor_base
            ((_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)
             ((long)&t.val.super__Variant_base<wasm::Name,_wasm::Err>.
                     super__Move_assign_alias<wasm::Name,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
             (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_a0);
  if (_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
      super__Move_assign_alias<wasm::Name,_wasm::Err>.
      super__Copy_assign_alias<wasm::Name,_wasm::Err>.super__Move_ctor_alias<wasm::Name,_wasm::Err>.
      super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
      super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\x01') {
    _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ = &local_40;
    std::__cxx11::string::_M_construct<char*>
              ((string *)
               ((long)&_val.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20),
               t.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_,
               _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._M_first._M_storage.
               super_IString.str._M_len +
               t.val.super__Variant_base<wasm::Name,_wasm::Err>.
               super__Move_assign_alias<wasm::Name,_wasm::Err>.
               super__Copy_assign_alias<wasm::Name,_wasm::Err>.
               super__Move_ctor_alias<wasm::Name,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
               super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_);
    puVar1 = (undefined8 *)
             ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10);
    *(undefined8 **)
     &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err> = puVar1;
    if ((undefined1 *)
        _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ == &local_40) {
      *puVar1 = CONCAT71(uStack_3f,local_40);
      *(undefined8 *)
       ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
               super__Move_assign_alias<wasm::Ok,_wasm::Err>.
               super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
               super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
               super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x18) = uStack_38;
    }
    else {
      *(undefined8 *)
       &(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err> =
           _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
           super__Move_assign_alias<wasm::Name,_wasm::Err>.
           super__Copy_assign_alias<wasm::Name,_wasm::Err>.
           super__Move_ctor_alias<wasm::Name,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
           super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_;
      *(ulong *)((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                        super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x10) =
           CONCAT71(uStack_3f,local_40);
    }
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 8) = local_48;
    local_40 = 0;
    *(__index_type *)
     ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Ok,_wasm::Err>.
             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>
             .super__Variant_storage_alias<wasm::Ok,_wasm::Err> + 0x20) = '\x01';
    _val.val.super__Variant_base<wasm::Name,_wasm::Err>.
    super__Move_assign_alias<wasm::Name,_wasm::Err>.super__Copy_assign_alias<wasm::Name,_wasm::Err>.
    super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
    super__Variant_storage_alias<wasm::Name,_wasm::Err>._32_8_ = &local_40;
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
               ((long)&t.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
  }
  else {
    std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
              ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)
               ((long)&t.val.super__Variant_base<wasm::Name,_wasm::Err>.
                       super__Move_assign_alias<wasm::Name,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Name,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Name,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Name,_wasm::Err> + 0x20));
    p_Var2 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)0x0;
    if (t.val.super__Variant_base<wasm::Name,_wasm::Err>.
        super__Move_assign_alias<wasm::Name,_wasm::Err>.
        super__Copy_assign_alias<wasm::Name,_wasm::Err>.
        super__Move_ctor_alias<wasm::Name,_wasm::Err>.super__Copy_ctor_alias<wasm::Name,_wasm::Err>.
        super__Variant_storage_alias<wasm::Name,_wasm::Err>._M_u._24_1_ == '\0') {
      p_Var2 = (_Copy_ctor_base<false,_wasm::Name,_wasm::Err> *)local_a0;
    }
    table_00.super_IString.str._M_str =
         (p_Var2->super__Variant_storage_alias<wasm::Name,_wasm::Err>)._M_u._M_first._M_storage.
         super_IString.str._M_str;
    table_00.super_IString.str._M_len = (size_t)local_a0;
    IRBuilder::makeCallIndirect
              ((Result<wasm::Ok> *)&local_c8,&this->irBuilder,table_00,type,isReturn);
    withLoc<wasm::Ok>(__return_storage_ptr__,this,pos,(Result<wasm::Ok> *)&local_c8);
    std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::~_Variant_storage
              (&local_c8);
  }
  std::__detail::__variant::_Variant_storage<false,_wasm::Name,_wasm::Err>::~_Variant_storage
            ((_Variant_storage<false,_wasm::Name,_wasm::Err> *)local_a0);
  return __return_storage_ptr__;
}

Assistant:

Result<> makeCallIndirect(Index pos,
                            const std::vector<Annotation>& annotations,
                            Name* table,
                            HeapType type,
                            bool isReturn) {
    auto t = getTable(pos, table);
    CHECK_ERR(t);
    return withLoc(pos, irBuilder.makeCallIndirect(*t, type, isReturn));
  }